

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpacePlatformAppearance.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::SpacePlatformAppearance::operator==
          (SpacePlatformAppearance *this,SpacePlatformAppearance *Value)

{
  return *this == *Value;
}

Assistant:

KBOOL SpacePlatformAppearance::operator == ( const SpacePlatformAppearance & Value ) const
{
	// Lets do a single comparison instead of checking every field. 
	// This struct is basically a KUINT32 so lets cast it to one and compare.

	KUINT32 a = *( KUINT32 * )this;
	KUINT32 b = *( KUINT32 * )&Value;

    if( a != b )return false;
    return true;
}